

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  cmTarget *pcVar1;
  int iVar2;
  string *psVar3;
  cmOSXBundleGenerator *this_00;
  string local_50;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator)._vptr_cmNinjaTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_0066cf90;
  (this->TargetNameOut)._M_dataplus._M_p = (pointer)&(this->TargetNameOut).field_2;
  (this->TargetNameOut)._M_string_length = 0;
  (this->TargetNameOut).field_2._M_local_buf[0] = '\0';
  (this->TargetNameSO)._M_dataplus._M_p = (pointer)&(this->TargetNameSO).field_2;
  (this->TargetNameSO)._M_string_length = 0;
  (this->TargetNameSO).field_2._M_local_buf[0] = '\0';
  (this->TargetNameReal)._M_dataplus._M_p = (pointer)&(this->TargetNameReal).field_2;
  (this->TargetNameReal)._M_string_length = 0;
  (this->TargetNameReal).field_2._M_local_buf[0] = '\0';
  (this->TargetNameImport)._M_dataplus._M_p = (pointer)&(this->TargetNameImport).field_2;
  (this->TargetNameImport)._M_string_length = 0;
  (this->TargetNameImport).field_2._M_local_buf[0] = '\0';
  (this->TargetNamePDB)._M_dataplus._M_p = (pointer)&(this->TargetNamePDB).field_2;
  (this->TargetNamePDB)._M_string_length = 0;
  (this->TargetNamePDB).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->TargetLinkLanguage,"",(allocator *)&local_50);
  pcVar1 = target->Target;
  psVar3 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator);
  cmTarget::GetLinkerLanguage(&local_50,pcVar1,psVar3);
  std::__cxx11::string::operator=((string *)&this->TargetLinkLanguage,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = cmGeneratorTarget::GetType(target);
  psVar3 = &((this->super_cmNinjaTargetGenerator).LocalGenerator)->ConfigName;
  if (iVar2 == 0) {
    cmTarget::GetExecutableNames
              (target->Target,&this->TargetNameOut,&this->TargetNameReal,&this->TargetNameImport,
               &this->TargetNamePDB,psVar3);
  }
  else {
    cmTarget::GetLibraryNames
              (target->Target,&this->TargetNameOut,&this->TargetNameSO,&this->TargetNameReal,
               &this->TargetNameImport,&this->TargetNamePDB,psVar3);
  }
  iVar2 = cmGeneratorTarget::GetType(target);
  if (iVar2 != 4) {
    pcVar1 = target->Target;
    psVar3 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator);
    cmTarget::GetDirectory(&local_50,pcVar1,psVar3,false);
    cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  psVar3 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,psVar3);
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator = this_00;
  this_00->MacContentFolders = &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::
cmNinjaNormalTargetGenerator(cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetNameOut()
  , TargetNameSO()
  , TargetNameReal()
  , TargetNameImport()
  , TargetNamePDB()
  , TargetLinkLanguage("")
{
  this->TargetLinkLanguage = target->Target
                                   ->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmTarget::EXECUTABLE)
    target->Target->GetExecutableNames(this->TargetNameOut,
                               this->TargetNameReal,
                               this->TargetNameImport,
                               this->TargetNamePDB,
                               GetLocalGenerator()->GetConfigName());
  else
    target->Target->GetLibraryNames(this->TargetNameOut,
                            this->TargetNameSO,
                            this->TargetNameReal,
                            this->TargetNameImport,
                            this->TargetNamePDB,
                            GetLocalGenerator()->GetConfigName());

  if(target->GetType() != cmTarget::OBJECT_LIBRARY)
    {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->Target->GetDirectory(this->GetConfigName()));
    }

  this->OSXBundleGenerator = new cmOSXBundleGenerator(target,
                                                      this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}